

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSAVETRD(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *fhobname;
  string local_a0;
  undefined4 local_80;
  allocator<char> local_69;
  string local_68 [8];
  string fnaamh;
  path fnaam;
  int lengthMinusVars;
  int autostart;
  int length;
  int start;
  aint val;
  bool addplace;
  bool replace;
  bool exec;
  
  if ((DeviceID == (char *)0x0) || (pass != 3)) {
    if (DeviceID == (char *)0x0) {
      Error("SAVETRD only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipToEol(&lp);
    return;
  }
  start._3_1_ = 1;
  start._2_1_ = 0;
  start._1_1_ = 0;
  autostart = -1;
  lengthMinusVars = -1;
  fnaam._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_ =
       -1;
  fnaam._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_4_ =
       -1;
  GetOutputFileName_abi_cxx11_((path *)((long)&fnaamh.field_2 + 8),&lp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_69);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      start._2_1_ = *lp == '|';
      if ((bool)start._2_1_) {
        lp = lp + 1;
        SkipBlanks(&lp);
      }
      else {
        start._1_1_ = *lp == '&';
        if ((bool)start._1_1_) {
          lp = lp + 1;
          SkipBlanks(&lp);
        }
      }
      GetDelimitedString_abi_cxx11_(&local_a0,&lp);
      std::__cxx11::string::operator=(local_68,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = anyComma(&lp);
      if (bVar1) {
        iVar2 = ParseExpressionNoSyntaxError(&lp,&length);
        if (((iVar2 != 0) && (-1 < length)) && (length < 0x10000)) {
          autostart = length;
        }
        bVar1 = anyComma(&lp);
        if (bVar1) {
          ParseExpressionNoSyntaxError(&lp,&lengthMinusVars);
          bVar1 = anyComma(&lp);
          if (bVar1) {
            if ((start._1_1_ & 1) != 0) {
              Error("[SAVETRD] Autostart is not used here",bp,PASS3);
              local_80 = 1;
              goto LAB_00112e49;
            }
            iVar2 = ParseExpression(&lp,&length);
            if (iVar2 == 0) {
              Error("[SAVETRD] Syntax error",bp,PASS3);
              local_80 = 1;
              goto LAB_00112e49;
            }
            if (length < 0) {
              Error("[SAVETRD] Negative values are not allowed",bp,PASS3);
              local_80 = 1;
              goto LAB_00112e49;
            }
            fnaam._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._4_4_ = length;
            bVar1 = anyComma(&lp);
            if (bVar1) {
              iVar2 = ParseExpression(&lp,&length);
              if (iVar2 == 0) {
                Error("[SAVETRD] Syntax error",bp,PASS3);
                local_80 = 1;
                goto LAB_00112e49;
              }
              fnaam._M_cmpts._M_impl._M_t.
              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
              _M_head_impl._0_4_ = length;
            }
          }
          if ((start._3_1_ & 1) != 0) {
            fhobname = (char *)std::__cxx11::string::c_str();
            TRD_AddFile((path *)((long)&fnaamh.field_2 + 8),fhobname,autostart,lengthMinusVars,
                        fnaam._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl._4_4_,(bool)(start._2_1_ & 1),(bool)(start._1_1_ & 1),
                        (int)fnaam._M_cmpts._M_impl._M_t.
                             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             .
                             super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                             ._M_head_impl);
          }
          local_80 = 0;
        }
        else {
          Error("[SAVETRD] Syntax error. No length",bp,SUPPRESS);
          local_80 = 1;
        }
      }
      else {
        Error("[SAVETRD] Syntax error. No address",bp,SUPPRESS);
        local_80 = 1;
      }
    }
    else {
      Error("[SAVETRD] No filename",bp,SUPPRESS);
      local_80 = 1;
    }
  }
  else {
    Error("[SAVETRD] Syntax error. No parameters",bp,SUPPRESS);
    local_80 = 1;
  }
LAB_00112e49:
  std::__cxx11::string::~string(local_68);
  std::filesystem::__cxx11::path::~path((path *)((long)&fnaamh.field_2 + 8));
  return;
}

Assistant:

static void dirSAVETRD() {
	if (!DeviceID || pass != LASTPASS) {
		if (!DeviceID) Error("SAVETRD only allowed in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}

	bool exec = true, replace = false, addplace = false;
	aint val;
	int start = -1, length = -1, autostart = -1, lengthMinusVars = -1;

	const std::filesystem::path fnaam = GetOutputFileName(lp);

	std::string fnaamh {""};
	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No parameters", bp, SUPPRESS);
	if (!anyComma(lp)) {
		if ((replace = ('|' == *lp))) SkipBlanks(++lp);	// detect "|" for "replace" feature
		else if ((addplace = ('&' == *lp))) SkipBlanks(++lp); // detect "&" for "addplace" feature
		fnaamh = GetDelimitedString(lp);
	}
	if (fnaamh.empty()) return Error("[SAVETRD] No filename", bp, SUPPRESS);

	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No address", bp, SUPPRESS);
	if (ParseExpressionNoSyntaxError(lp, val) && 0 <= val && val <= 0xFFFF) {
		start = val;
	}	// else start == -1 (syntax error or invalid value)
	if (!anyComma(lp)) return Error("[SAVETRD] Syntax error. No length", bp, SUPPRESS);
	ParseExpressionNoSyntaxError(lp, length);	// parse error/invalid value will be reported later

	if (anyComma(lp)) {
		if (addplace) {
			Error("[SAVETRD] Autostart is not used here", bp, PASS3); return;
		} else {
			if (!ParseExpression(lp, val)) {
				Error("[SAVETRD] Syntax error", bp, PASS3); return;
			}
			if (val < 0) {
				Error("[SAVETRD] Negative values are not allowed", bp, PASS3); return;
			}
			autostart = val;
			// optional length of BASIC without variables
			if (anyComma(lp)) {
				if (!ParseExpression(lp, val)) {
					Error("[SAVETRD] Syntax error", bp, PASS3); return;
				}
				lengthMinusVars = val;
			}
		}
	}

	if (exec) TRD_AddFile(fnaam, fnaamh.c_str(), start, length, autostart, replace, addplace, lengthMinusVars);
}